

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::anon_unknown_14::XmlReporter::report_query(XmlReporter *this,QueryData *in)

{
  XmlWriter *name;
  string *psVar1;
  ContextOptions *pCVar2;
  _Alloc_hider _Var3;
  _Base_ptr p_Var4;
  ulong uVar5;
  TestCaseData *file;
  uint i;
  allocator local_fd;
  allocator local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  string *local_f8;
  undefined1 local_f0 [32];
  string local_d0;
  string local_b0 [32];
  XmlReporter *local_90;
  char *local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  (*(this->super_IReporter)._vptr_IReporter[1])();
  pCVar2 = this->opt;
  local_90 = this;
  if (pCVar2->list_reporters == true) {
    getListeners();
    local_f8 = (string *)&this->xml;
    psVar1 = (string *)(local_f0 + 0x20);
    for (p_Var4 = getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &getListeners::data._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::string((string *)(local_f0 + 0x40),"Listener",(allocator *)&local_50);
      XmlWriter::scopedElement((XmlWriter *)(local_80 + 0x10),local_f8);
      std::__cxx11::string::string((string *)psVar1,"priority",(allocator *)local_80);
      _Var3._M_p = local_70._M_dataplus._M_p;
      XmlWriter::writeAttribute<int>
                ((XmlWriter *)local_70._M_dataplus._M_p,psVar1,(int *)(p_Var4 + 1));
      std::__cxx11::string::string((string *)local_f0,"name",(allocator *)&local_88);
      XmlWriter::writeAttribute<doctest::String>
                ((XmlWriter *)_Var3._M_p,(string *)local_f0,(String *)&p_Var4[1]._M_parent);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)psVar1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_80 + 0x10));
      std::__cxx11::string::~string((string *)(local_f0 + 0x40));
    }
    getReporters();
    psVar1 = (string *)(local_f0 + 0x20);
    for (p_Var4 = getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &getReporters::data._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::string((string *)(local_f0 + 0x40),"Reporter",(allocator *)&local_50);
      XmlWriter::scopedElement((XmlWriter *)(local_80 + 0x10),local_f8);
      std::__cxx11::string::string((string *)psVar1,"priority",(allocator *)local_80);
      _Var3._M_p = local_70._M_dataplus._M_p;
      XmlWriter::writeAttribute<int>
                ((XmlWriter *)local_70._M_dataplus._M_p,psVar1,(int *)(p_Var4 + 1));
      std::__cxx11::string::string((string *)local_f0,"name",(allocator *)&local_88);
      XmlWriter::writeAttribute<doctest::String>
                ((XmlWriter *)_Var3._M_p,(string *)local_f0,(String *)&p_Var4[1]._M_parent);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)psVar1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_80 + 0x10));
      std::__cxx11::string::~string((string *)(local_f0 + 0x40));
    }
  }
  else {
    if ((pCVar2->count == false) && (pCVar2->list_test_cases != true)) {
      if (pCVar2->list_test_suites != true) goto LAB_00118ecc;
      psVar1 = (string *)(local_f0 + 0x20);
      name = &this->xml;
      for (uVar5 = 0; uVar5 < in->num_data; uVar5 = uVar5 + 1) {
        std::__cxx11::string::string
                  ((string *)(local_f0 + 0x40),"TestSuite",(allocator *)(local_80 + 0x10));
        XmlWriter::scopedElement((XmlWriter *)local_f0,(string *)name);
        std::__cxx11::string::string((string *)psVar1,"name",(allocator *)&local_50);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  ((ScopedElement *)local_f0,psVar1,&in->data[uVar5]->m_test_suite);
        std::__cxx11::string::~string((string *)psVar1);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_f0);
        std::__cxx11::string::~string((string *)(local_f0 + 0x40));
      }
      std::__cxx11::string::string
                ((string *)(local_f0 + 0x40),"OverallResultsTestCases",
                 (allocator *)(local_80 + 0x10));
      XmlWriter::scopedElement((XmlWriter *)local_f0,(string *)name);
      std::__cxx11::string::string((string *)(local_f0 + 0x20),"unskipped",(allocator *)&local_50);
      XmlWriter::writeAttribute<unsigned_int>
                ((XmlWriter *)local_f0._0_8_,(string *)(local_f0 + 0x20),
                 &in->run_stats->numTestCasesPassingFilters);
      std::__cxx11::string::~string((string *)(local_f0 + 0x20));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_f0);
      std::__cxx11::string::~string((string *)(local_f0 + 0x40));
      std::__cxx11::string::string
                ((string *)(local_f0 + 0x40),"OverallResultsTestSuites",
                 (allocator *)(local_80 + 0x10));
      XmlWriter::scopedElement((XmlWriter *)local_f0,(string *)name);
      std::__cxx11::string::string((string *)(local_f0 + 0x20),"unskipped",(allocator *)&local_50);
      XmlWriter::writeAttribute<unsigned_int>
                ((XmlWriter *)local_f0._0_8_,(string *)(local_f0 + 0x20),
                 &in->run_stats->numTestSuitesPassingFilters);
    }
    else {
      psVar1 = (string *)(local_80 + 0x10);
      local_f8 = (string *)&this->xml;
      for (uVar5 = 0; uVar5 < in->num_data; uVar5 = uVar5 + 1) {
        std::__cxx11::string::string((string *)(local_f0 + 0x40),"TestCase",&local_f9);
        XmlWriter::scopedElement((XmlWriter *)local_80,local_f8);
        std::__cxx11::string::string((string *)(local_f0 + 0x20),"name",&local_fa);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  ((ScopedElement *)local_80,(string *)(local_f0 + 0x20),&in->data[uVar5]->m_name);
        std::__cxx11::string::string((string *)local_f0,"testsuite",&local_fb);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  ((ScopedElement *)local_80,(string *)local_f0,&in->data[uVar5]->m_test_suite);
        std::__cxx11::string::string((string *)psVar1,"filename",&local_fc);
        file = in->data[uVar5];
        if ((file->m_file).field_0.buf[0x17] < '\0') {
          file = (TestCaseData *)(file->m_file).field_0.data.ptr;
        }
        local_88 = skipPathFromFilename((char *)file);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  ((ScopedElement *)local_80,psVar1,&local_88);
        std::__cxx11::string::string((string *)&local_50,"line",&local_fd);
        local_80._12_4_ = 0;
        if (local_90->opt->no_line_numbers == false) {
          local_80._12_4_ = in->data[uVar5]->m_line;
        }
        XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                  ((ScopedElement *)local_80,&local_50,(uint *)(local_80 + 0xc));
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)psVar1);
        std::__cxx11::string::~string((string *)local_f0);
        std::__cxx11::string::~string((string *)(local_f0 + 0x20));
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
        std::__cxx11::string::~string((string *)(local_f0 + 0x40));
      }
      std::__cxx11::string::string
                ((string *)(local_f0 + 0x40),"OverallResultsTestCases",
                 (allocator *)(local_80 + 0x10));
      XmlWriter::scopedElement((XmlWriter *)local_f0,local_f8);
      std::__cxx11::string::string((string *)(local_f0 + 0x20),"unskipped",(allocator *)&local_50);
      XmlWriter::writeAttribute<unsigned_int>
                ((XmlWriter *)local_f0._0_8_,(string *)(local_f0 + 0x20),
                 &in->run_stats->numTestCasesPassingFilters);
    }
    std::__cxx11::string::~string((string *)(local_f0 + 0x20));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_f0);
    std::__cxx11::string::~string((string *)(local_f0 + 0x40));
  }
LAB_00118ecc:
  XmlWriter::endElement(&local_90->xml);
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            test_run_start();
            if(opt.list_reporters) {
                for(auto& curr : getListeners())
                    xml.scopedElement("Listener")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
                for(auto& curr : getReporters())
                    xml.scopedElement("Reporter")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
            } else if(opt.count || opt.list_test_cases) {
                for(unsigned i = 0; i < in.num_data; ++i) {
                    xml.scopedElement("TestCase").writeAttribute("name", in.data[i]->m_name)
                        .writeAttribute("testsuite", in.data[i]->m_test_suite)
                        .writeAttribute("filename", skipPathFromFilename(in.data[i]->m_file.c_str()))
                        .writeAttribute("line", line(in.data[i]->m_line));
                }
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
            } else if(opt.list_test_suites) {
                for(unsigned i = 0; i < in.num_data; ++i)
                    xml.scopedElement("TestSuite").writeAttribute("name", in.data[i]->m_test_suite);
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
                xml.scopedElement("OverallResultsTestSuites")
                        .writeAttribute("unskipped", in.run_stats->numTestSuitesPassingFilters);
            }
            xml.endElement();
        }